

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  int32 iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  Type TVar7;
  CppType CVar8;
  string *psVar9;
  Descriptor *pDVar10;
  EnumDescriptor *pEVar11;
  FieldOptions *pFVar12;
  FieldOptions *pFVar13;
  string sStack_38;
  
  FieldDescriptorProto::_internal_set_name(proto,*(string **)this);
  iVar2 = *(int32 *)(this + 0x44);
  uVar6 = (proto->_has_bits_).has_bits_[0] | 0x40;
  (proto->_has_bits_).has_bits_[0] = uVar6;
  proto->number_ = iVar2;
  if (this[0x41] == (FieldDescriptor)0x1) {
    FieldDescriptorProto::_internal_set_json_name(proto,*(string **)(this + 0x20));
    uVar6 = (proto->_has_bits_).has_bits_[0];
  }
  iVar3 = *(int *)(this + 0x3c);
  (proto->_has_bits_).has_bits_[0] = uVar6 | 0x100;
  proto->label_ = iVar3;
  TVar7 = type(this);
  pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
  *pbVar1 = *pbVar1 | 2;
  proto->type_ = TVar7;
  if (this[0x42] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x50) + 0x89) == '\0') {
      FieldDescriptorProto::set_extendee(proto,".");
    }
    psVar9 = FieldDescriptorProto::_internal_mutable_extendee_abi_cxx11_(proto);
    std::__cxx11::string::append((string *)psVar9);
  }
  CVar8 = cpp_type(this);
  if (CVar8 == CPPTYPE_MESSAGE) {
    pDVar10 = message_type(this);
    if (pDVar10[0x88] == (Descriptor)0x1) {
      proto->type_ = 1;
      pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    pDVar10 = message_type(this);
    if (pDVar10[0x89] == (Descriptor)0x0) {
      FieldDescriptorProto::set_type_name(proto,".");
    }
    psVar9 = FieldDescriptorProto::_internal_mutable_type_name_abi_cxx11_(proto);
    message_type(this);
  }
  else {
    CVar8 = cpp_type(this);
    if (CVar8 != CPPTYPE_ENUM) goto LAB_0028de79;
    pEVar11 = enum_type(this);
    if (pEVar11[0x29] == (EnumDescriptor)0x0) {
      FieldDescriptorProto::set_type_name(proto,".");
    }
    psVar9 = FieldDescriptorProto::_internal_mutable_type_name_abi_cxx11_(proto);
    enum_type(this);
  }
  std::__cxx11::string::append((string *)psVar9);
LAB_0028de79:
  if (this[0x40] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&sStack_38,this,false);
    FieldDescriptorProto::set_default_value(proto,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  lVar4 = *(long *)(this + 0x58);
  if ((lVar4 != 0) && (this[0x42] == (FieldDescriptor)0x0)) {
    lVar5 = *(long *)(*(long *)(lVar4 + 0x10) + 0x30);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int32)((lVar4 - lVar5) / 0x30);
  }
  pFVar13 = *(FieldOptions **)(this + 0x78);
  pFVar12 = FieldOptions::default_instance();
  if (pFVar13 != pFVar12) {
    pFVar13 = FieldDescriptorProto::_internal_mutable_options(proto);
    FieldOptions::CopyFrom(pFVar13,*(FieldOptions **)(this + 0x78));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
      implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
      implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}